

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse_levinson_durbin_recursion.cc
# Opt level: O1

bool __thiscall
sptk::ReverseLevinsonDurbinRecursion::Run
          (ReverseLevinsonDurbinRecursion *this,
          vector<double,_std::allocator<double>_> *linear_predictive_coefficients,
          vector<double,_std::allocator<double>_> *autocorrelation,Buffer *buffer)

{
  SymmetricMatrix *pSVar1;
  ulong uVar2;
  double dVar3;
  ReverseLevinsonDurbinRecursion *pRVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  bool bVar8;
  ulong uVar9;
  int iVar10;
  size_type __new_size;
  ulong uVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  Row local_88;
  ReverseLevinsonDurbinRecursion *local_70;
  ulong local_68;
  pointer local_60;
  double local_58;
  double *local_50;
  SymmetricMatrix *local_48;
  long local_40;
  ulong local_38;
  
  if (this->is_valid_ == true) {
    bVar8 = false;
    if (((buffer != (Buffer *)0x0) &&
        (bVar8 = false, autocorrelation != (vector<double,_std::allocator<double>_> *)0x0)) &&
       (__new_size = (long)this->num_order_ + 1,
       (long)(linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_start >> 3 == __new_size)) {
      local_70 = this;
      if ((long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(autocorrelation,__new_size);
      }
      pSVar1 = &buffer->u_;
      if ((buffer->u_).num_dimension_ != (int)__new_size) {
        SymmetricMatrix::Resize(pSVar1,(int)__new_size);
      }
      if ((long)(buffer->e_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->e_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(&buffer->e_,__new_size);
      }
      pdVar6 = (linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      local_50 = (autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      local_60 = (buffer->e_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (-1 < local_70->num_order_) {
        iVar10 = -1;
        do {
          iVar10 = iVar10 + 1;
          local_88._vptr_Row = (_func_int **)&PTR__Row_0010fd28;
          local_88.matrix_ = pSVar1;
          local_88.row_ = iVar10;
          pdVar5 = SymmetricMatrix::Row::operator[](&local_88,iVar10);
          *pdVar5 = 1.0;
        } while (iVar10 < local_70->num_order_);
      }
      pRVar4 = local_70;
      local_88.row_ = local_70->num_order_;
      if (0 < local_88.row_) {
        lVar12 = 0;
        iVar10 = 0;
        do {
          dVar14 = pdVar6[lVar12 + local_88.row_];
          local_88._vptr_Row = (_func_int **)&PTR__Row_0010fd28;
          local_88.matrix_ = pSVar1;
          pdVar5 = SymmetricMatrix::Row::operator[](&local_88,iVar10);
          *pdVar5 = dVar14;
          iVar10 = iVar10 + 1;
          local_88.row_ = pRVar4->num_order_;
          lVar12 = lVar12 + -1;
        } while (iVar10 < local_88.row_);
      }
      dVar14 = *pdVar6;
      local_60[local_88.row_] = dVar14 * dVar14;
      local_48 = pSVar1;
      if (0 < local_88.row_) {
        uVar9 = (ulong)(local_88.row_ - 1);
        local_40 = (ulong)(uint)local_88.row_ * 8 + -8;
        uVar11 = (ulong)(uint)local_88.row_;
        do {
          local_68 = uVar11 - 1;
          local_88._vptr_Row = (_func_int **)&PTR__Row_0010fd28;
          local_88.row_ = (int)uVar11;
          local_88.matrix_ = pSVar1;
          pdVar6 = SymmetricMatrix::Row::operator[](&local_88,0);
          dVar14 = 1.0 / (1.0 - *pdVar6 * *pdVar6);
          local_38 = uVar11;
          if (1 < (long)uVar11) {
            pdVar5 = (double *)((long)pdVar6 + local_40);
            uVar11 = 0;
            local_58 = dVar14;
            do {
              uVar2 = uVar11 + 1;
              dVar14 = pdVar6[uVar11 + 1];
              dVar13 = *pdVar6;
              dVar3 = *pdVar5;
              local_88._vptr_Row = (_func_int **)&PTR__Row_0010fd28;
              local_88.row_ = (int)local_68;
              local_88.matrix_ = pSVar1;
              pdVar7 = SymmetricMatrix::Row::operator[](&local_88,(int)uVar11);
              *pdVar7 = (dVar14 - dVar13 * dVar3) * local_58;
              pdVar5 = pdVar5 + -1;
              uVar11 = uVar2;
              dVar14 = local_58;
            } while (uVar9 != uVar2);
          }
          local_60[local_68] = dVar14 * local_60[local_38];
          uVar9 = uVar9 - 1;
          local_40 = local_40 + -8;
          uVar11 = local_68;
        } while (1 < (long)local_38);
      }
      pSVar1 = local_48;
      *local_50 = *local_60;
      bVar8 = true;
      if (0 < local_70->num_order_) {
        local_68 = 1;
        local_58 = 0.0;
        do {
          dVar14 = 0.0;
          if (1 < local_68) {
            iVar10 = (int)local_68;
            dVar13 = local_58;
            do {
              local_88._vptr_Row = (_func_int **)&PTR__Row_0010fd28;
              local_88.matrix_ = pSVar1;
              lVar12 = (long)dVar13 + -1;
              local_88.row_ = iVar10 + -1;
              pdVar6 = SymmetricMatrix::Row::operator[](&local_88,(int)lVar12);
              dVar14 = dVar14 + *pdVar6 * local_50[(long)dVar13];
              dVar13 = (double)lVar12;
            } while (lVar12 != 0);
          }
          uVar11 = local_68;
          local_88._vptr_Row = (_func_int **)&PTR__Row_0010fd28;
          local_88.matrix_ = pSVar1;
          local_88.row_ = (int)local_68;
          pdVar6 = SymmetricMatrix::Row::operator[](&local_88,0);
          local_50[uVar11] = -(*pdVar6 * local_60[uVar11 - 1] + dVar14);
          local_68 = uVar11 + 1;
          local_58 = (double)((long)local_58 + 1);
        } while ((long)uVar11 < (long)local_70->num_order_);
        bVar8 = true;
      }
    }
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool ReverseLevinsonDurbinRecursion::Run(
    const std::vector<double>& linear_predictive_coefficients,
    std::vector<double>* autocorrelation,
    ReverseLevinsonDurbinRecursion::Buffer* buffer) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      linear_predictive_coefficients.size() !=
          static_cast<std::size_t>(length) ||
      NULL == autocorrelation || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (autocorrelation->size() != static_cast<std::size_t>(length)) {
    autocorrelation->resize(length);
  }
  if (buffer->u_.GetNumDimension() != length) {
    buffer->u_.Resize(length);
  }
  if (buffer->e_.size() != static_cast<std::size_t>(length)) {
    buffer->e_.resize(length);
  }

  const double* a(&(linear_predictive_coefficients[0]));
  double* r(&((*autocorrelation)[0]));
  double* e(&(buffer->e_[0]));

  for (int j(0); j <= num_order_; ++j) {
    buffer->u_[j][j] = 1.0;
  }
  for (int j(0); j < num_order_; ++j) {
    buffer->u_[num_order_][j] = a[num_order_ - j];
  }
  e[num_order_] = a[0] * a[0];

  for (int i(num_order_ - 1); 0 <= i; --i) {
    const double* u(&(buffer->u_[i + 1][0]));
    const double t(1.0 / (1.0 - u[0] * u[0]));
    for (int j(0); j < i; ++j) {
      buffer->u_[i][j] = (u[j + 1] - u[0] * u[i - j]) * t;
    }
    e[i] = e[i + 1] * t;
  }

  r[0] = e[0];
  for (int i(1); i <= num_order_; ++i) {
    double sum(0.0);
    for (int j(1); j < i; ++j) {
      sum += buffer->u_[i - 1][i - j - 1] * r[i - j];
    }
    r[i] = -(sum + buffer->u_[i][0] * e[i - 1]);
  }

  return true;
}